

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_7uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  
  for (uVar16 = 0; uVar16 < (length & 0xfffffffffffffff8); uVar16 = uVar16 + 8) {
    bVar1 = *pSrc;
    bVar2 = pSrc[1];
    bVar3 = pSrc[2];
    bVar4 = pSrc[3];
    bVar5 = pSrc[4];
    bVar6 = pSrc[5];
    bVar7 = pSrc[6];
    pSrc = pSrc + 7;
    pDst[uVar16] = (uint)(bVar1 >> 1);
    pDst[uVar16 + 1] = (uint)(bVar2 >> 2) | (bVar1 & 1) << 6;
    pDst[uVar16 + 2] = (uint)(bVar3 >> 3) | (bVar2 & 3) << 5;
    pDst[uVar16 + 3] = (uint)(bVar4 >> 4) | (bVar3 & 7) << 4;
    pDst[uVar16 + 4] = (uint)(bVar5 >> 5) + (bVar4 & 0xf) * 8;
    pDst[uVar16 + 5] = (uint)(bVar6 >> 6) + (bVar5 & 0x1f) * 4;
    pDst[uVar16 + 6] = (uint)(bVar7 >> 7) + (bVar6 & 0x3f) * 2;
    pDst[uVar16 + 7] = bVar7 & 0x7f;
  }
  if ((length & 7) != 0) {
    bVar1 = *pSrc;
    pDst[uVar16] = (uint)(bVar1 >> 1);
    uVar15 = (uint)(length & 7);
    if (uVar15 != 1) {
      uVar11 = 0;
      iVar8 = 1;
      iVar14 = 7;
      while( true ) {
        uVar10 = (uint)bVar1;
        pbVar12 = pSrc + 1;
        iVar13 = iVar14 - iVar8;
        if (iVar13 == 0 || iVar14 < iVar8) break;
        uVar11 = (uVar11 | uVar10 & ~(-1 << (sbyte)iVar8)) << ((byte)iVar13 & 0x1f);
        bVar1 = *pbVar12;
        iVar8 = 8;
        pSrc = pbVar12;
        iVar14 = iVar13;
      }
      iVar8 = iVar8 - iVar14;
      pDst[uVar16 + 1] =
           ~(-1 << ((byte)iVar14 & 0x1f)) & (uint)(bVar1 >> ((byte)iVar8 & 0x1f)) | uVar11;
      if (2 < uVar15) {
        if (iVar8 == 0) {
          pbVar9 = pSrc + 2;
          uVar11 = 0;
          iVar14 = 7;
          goto LAB_0010dd9d;
        }
        uVar11 = 0;
        iVar13 = 7;
        while (iVar14 = iVar13 - iVar8, iVar14 != 0 && iVar8 <= iVar13) {
          uVar11 = (uVar11 | uVar10 & ~(-1 << ((byte)iVar8 & 0x1f))) << ((byte)iVar14 & 0x1f);
          pbVar9 = pbVar12 + 1;
LAB_0010dd9d:
          uVar10 = (uint)*pbVar12;
          pbVar12 = pbVar9;
          iVar13 = iVar14;
          iVar8 = 8;
        }
        iVar8 = iVar8 - iVar13;
        pDst[uVar16 + 2] = ~(-1 << ((byte)iVar13 & 0x1f)) & uVar10 >> ((byte)iVar8 & 0x1f) | uVar11;
        if (uVar15 != 3) {
          uVar11 = 0;
          iVar13 = 7;
          iVar14 = 7;
          if (iVar8 != 0) goto LAB_0010de13;
          while( true ) {
            iVar13 = iVar14;
            uVar10 = (uint)*pbVar12;
            pbVar12 = pbVar12 + 1;
            iVar8 = 8;
LAB_0010de13:
            iVar14 = iVar13 - iVar8;
            if (iVar14 == 0 || iVar13 < iVar8) break;
            uVar11 = (uVar11 | uVar10 & ~(-1 << ((byte)iVar8 & 0x1f))) << ((byte)iVar14 & 0x1f);
          }
          iVar8 = iVar8 - iVar13;
          pDst[uVar16 + 3] =
               ~(-1 << ((byte)iVar13 & 0x1f)) & uVar10 >> ((byte)iVar8 & 0x1f) | uVar11;
          if (4 < uVar15) {
            uVar11 = 0;
            iVar13 = 7;
            iVar14 = 7;
            if (iVar8 != 0) goto LAB_0010de77;
            while( true ) {
              iVar13 = iVar14;
              uVar10 = (uint)*pbVar12;
              pbVar12 = pbVar12 + 1;
              iVar8 = 8;
LAB_0010de77:
              iVar14 = iVar13 - iVar8;
              if (iVar14 == 0 || iVar13 < iVar8) break;
              uVar11 = (uVar11 | uVar10 & ~(-1 << ((byte)iVar8 & 0x1f))) << ((byte)iVar14 & 0x1f);
            }
            iVar8 = iVar8 - iVar13;
            pDst[uVar16 + 4] =
                 ~(-1 << ((byte)iVar13 & 0x1f)) & uVar10 >> ((byte)iVar8 & 0x1f) | uVar11;
            if (uVar15 != 5) {
              uVar11 = 0;
              iVar13 = 7;
              iVar14 = 7;
              if (iVar8 != 0) goto LAB_0010dedb;
              while( true ) {
                iVar13 = iVar14;
                uVar10 = (uint)*pbVar12;
                pbVar12 = pbVar12 + 1;
                iVar8 = 8;
LAB_0010dedb:
                iVar14 = iVar13 - iVar8;
                if (iVar14 == 0 || iVar13 < iVar8) break;
                uVar11 = (uVar11 | uVar10 & ~(-1 << ((byte)iVar8 & 0x1f))) << ((byte)iVar14 & 0x1f);
              }
              iVar8 = iVar8 - iVar13;
              pDst[uVar16 + 5] =
                   ~(-1 << ((byte)iVar13 & 0x1f)) & uVar10 >> ((byte)iVar8 & 0x1f) | uVar11;
              if (uVar15 == 7) {
                uVar15 = 0;
                iVar13 = 7;
                iVar14 = 7;
                if (iVar8 != 0) goto LAB_0010df3b;
                while( true ) {
                  iVar13 = iVar14;
                  uVar10 = (uint)*pbVar12;
                  pbVar12 = pbVar12 + 1;
                  iVar8 = 8;
LAB_0010df3b:
                  iVar14 = iVar13 - iVar8;
                  if (iVar14 == 0 || iVar13 < iVar8) break;
                  uVar15 = (uVar15 | uVar10 & ~(-1 << ((byte)iVar8 & 0x1f))) <<
                           ((byte)iVar14 & 0x1f);
                }
                pDst[uVar16 + 6] =
                     ~(-1 << ((byte)iVar13 & 0x1f)) & uVar10 >> ((byte)iVar8 - (byte)iVar13 & 0x1f)
                     | uVar15;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_7uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		OPJ_UINT32 val5 = *pSrc++;
		OPJ_UINT32 val6 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 >> 1));
		pDst[i+1] = (OPJ_INT32)(((val0 & 0x1U) << 6) | (val1 >> 2));
		pDst[i+2] = (OPJ_INT32)(((val1 & 0x3U) << 5) | (val2 >> 3));
		pDst[i+3] = (OPJ_INT32)(((val2 & 0x7U) << 4) | (val3 >> 4));
		pDst[i+4] = (OPJ_INT32)(((val3 & 0xFU) << 3) | (val4 >> 5));
		pDst[i+5] = (OPJ_INT32)(((val4 & 0x1FU) << 2) | (val5 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val5 & 0x3FU) << 1) | (val6 >> 7));
		pDst[i+7] = (OPJ_INT32)(((val6 & 0x7FU)));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 7)
		
		if (length > 1U) {
			GETBITS(pDst[i+1], 7)
			if (length > 2U) {
				GETBITS(pDst[i+2], 7)
				if (length > 3U) {
					GETBITS(pDst[i+3], 7)
					if (length > 4U) {
						GETBITS(pDst[i+4], 7)
						if (length > 5U) {
							GETBITS(pDst[i+5], 7)
							if (length > 6U) {
								GETBITS(pDst[i+6], 7)
							}
						}
					}
				}
			}
		}
	}
}